

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Appearance_PDU::Encode(Appearance_PDU *this,KDataStream *stream)

{
  byte bVar1;
  
  LE_Header::Encode(&this->super_LE_Header,stream);
  KDataStream::Write(stream,(this->m_AppearanceFlag1Union).m_ui8Flag);
  bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  if ((char)bVar1 < '\0') {
    KDataStream::Write(stream,(this->m_AppearanceFlag2Union).m_ui8Flag);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 1) != 0) {
    KDataStream::Write(stream,this->m_ui8ForceID);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 2) != 0) {
    (*(this->m_EntityType).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_EntityType,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 4) != 0) {
    (*(this->m_AltEntityType).super_DataTypeBase._vptr_DataTypeBase[5])
              (&this->m_AltEntityType,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 8) != 0) {
    (*(this->m_EntityMarking).super_DataTypeBase._vptr_DataTypeBase[5])
              (&this->m_EntityMarking,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 0x10) != 0) {
    (*(this->m_EntityCapabilities).super_DataTypeBase._vptr_DataTypeBase[5])
              (&this->m_EntityCapabilities,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 0x20) != 0) {
    (*(this->m_VisApp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_VisApp,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 0x40) != 0) {
    (*(this->m_IRApp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_IRApp,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((char)bVar1 < '\0') {
    bVar1 = (this->m_AppearanceFlag2Union).m_ui8Flag;
    if ((bVar1 & 1) != 0) {
      (*(this->m_EMApp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_EMApp,stream);
      bVar1 = (this->m_AppearanceFlag2Union).m_ui8Flag;
    }
    if ((bVar1 & 2) != 0) {
      (*(this->m_AudApp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_AudApp,stream);
      return;
    }
  }
  return;
}

Assistant:

void Appearance_PDU::Encode( KDataStream & stream ) const
{
    LE_Header::Encode( stream );

    stream << m_AppearanceFlag1Union.m_ui8Flag;

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        stream << m_AppearanceFlag2Union.m_ui8Flag;
    }

    if( m_AppearanceFlag1Union.m_ui8ForceId )
    {
        stream << m_ui8ForceID;
    }

    if( m_AppearanceFlag1Union.m_ui8Typ )
    {
        stream << KDIS_STREAM m_EntityType;
    }

    if( m_AppearanceFlag1Union.m_ui8AltTyp )
    {
        stream << KDIS_STREAM m_AltEntityType;
    }

    if( m_AppearanceFlag1Union.m_ui8Mark )
    {
        stream << KDIS_STREAM m_EntityMarking;
    }

    if( m_AppearanceFlag1Union.m_ui8Cap )
    {
        stream << KDIS_STREAM m_EntityCapabilities;
    }

    if( m_AppearanceFlag1Union.m_ui8Vis )
    {
        stream << KDIS_STREAM m_VisApp;
    }

    if( m_AppearanceFlag1Union.m_ui8IR )
    {
        stream << KDIS_STREAM m_IRApp;
    }

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        if( m_AppearanceFlag2Union.m_ui8EM )
        {
            stream << KDIS_STREAM m_EMApp;
        }

        if( m_AppearanceFlag2Union.m_ui8Audio )
        {
            stream << KDIS_STREAM m_AudApp;
        }
    }
}